

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O0

void __thiscall QFontCache::decreaseCost(QFontCache *this,uint cost)

{
  uint local_1c;
  uint cost_local;
  QFontCache *this_local;
  
  local_1c = cost + 0x200 >> 10;
  if (local_1c == 0) {
    local_1c = 1;
  }
  this->total_cost = this->total_cost - local_1c;
  return;
}

Assistant:

void QFontCache::decreaseCost(uint cost)
{
    cost = (cost + 512) / 1024; // cost is stored in kb
    cost = cost > 0 ? cost : 1;
    Q_ASSERT(cost <= total_cost);
    total_cost -= cost;

    FC_DEBUG("  COST: decreased %u kb, total_cost %u kb, max_cost %u kb",
            cost, total_cost, max_cost);
}